

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfAttribute.h
# Opt level: O0

TypedAttribute<Imath_2_5::Matrix33<double>_> *
Imf_2_5::TypedAttribute<Imath_2_5::Matrix33<double>_>::cast(Attribute *attribute)

{
  TypeExc *this;
  long in_RDI;
  TypedAttribute<Imath_2_5::Matrix33<double>_> *t;
  TypedAttribute<Imath_2_5::Matrix33<double>_> *local_20;
  
  if (in_RDI == 0) {
    local_20 = (TypedAttribute<Imath_2_5::Matrix33<double>_> *)0x0;
  }
  else {
    local_20 = (TypedAttribute<Imath_2_5::Matrix33<double>_> *)
               __dynamic_cast(in_RDI,&Attribute::typeinfo,
                              &TypedAttribute<Imath_2_5::Matrix33<double>>::typeinfo,0);
  }
  if (local_20 == (TypedAttribute<Imath_2_5::Matrix33<double>_> *)0x0) {
    this = (TypeExc *)__cxa_allocate_exception(0x48);
    Iex_2_5::TypeExc::TypeExc(this,"Unexpected attribute type.");
    __cxa_throw(this,&Iex_2_5::TypeExc::typeinfo,Iex_2_5::TypeExc::~TypeExc);
  }
  return local_20;
}

Assistant:

const TypedAttribute<T> *
TypedAttribute<T>::cast (const Attribute *attribute)
{
    const TypedAttribute<T> *t =
	dynamic_cast <const TypedAttribute<T> *> (attribute);

    if (t == 0)
	throw IEX_NAMESPACE::TypeExc ("Unexpected attribute type.");

    return t;
}